

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SupplyAppearance.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::SupplyAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SupplyAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Supply Appearance:",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Paint Scheme:         ",0x16);
  ENUMS::GetEnumAsStringEntityPaintScheme_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Damage:               ",0x16);
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Parachute Status:     ",0x16);
  ENUMS::GetEnumAsStringParachute_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)((uint)*this >> 7 & 3),Value_01);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Flaming Effect:       ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Frozen Status:        ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"State:                ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Deployed Status:      ",0x16);
  ENUMS::GetEnumAsStringSupplyDeployed_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)((byte)this->field_0x3 & 3),Value_02);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Masked/Cloaked:       ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\t",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString SupplyAppearance::GetAsString() const
{
    KStringStream ss;

    ss <<            "Supply Appearance:"
       << sRetTab << "Paint Scheme:         " << GetEnumAsStringEntityPaintScheme( m_PaintScheme )
       << sRetTab << "Damage:               " << GetEnumAsStringEntityDamage( m_Damage )
       << sRetTab << "Parachute Status:     " << GetEnumAsStringParachute( m_ParachuteStatus )
       << sRetTab << "Flaming Effect:       " << m_FlamingEffectField
       << sRetTab << "Frozen Status:        " << m_FrozenStatus
       << sRetTab << "State:                " << m_State
       << sRetTab << "Deployed Status:      " << GetEnumAsStringSupplyDeployed( m_DeployedStatus )
       << sRetTab << "Masked/Cloaked:       " << m_MaskedCloaked
       << sRetTab;

    return ss.str();
}